

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_store(FuncState *fs,ExpDesc *var,ExpDesc *e)

{
  uint uVar1;
  uint32_t uVar2;
  VarInfo *pVVar3;
  BCReg BVar4;
  BCReg BVar5;
  BCReg rc;
  BCReg ra_1;
  BCReg ra;
  BCIns ins;
  ExpDesc *e_local;
  ExpDesc *var_local;
  FuncState *fs_local;
  
  if (var->k == VLOCAL) {
    pVVar3 = fs->ls->vstack;
    uVar1 = (var->u).s.aux;
    pVVar3[uVar1].info = pVVar3[uVar1].info | 1;
    expr_free(fs,e);
    expr_toreg(fs,e,(var->u).s.info);
  }
  else {
    if (var->k == VUPVAL) {
      pVVar3 = fs->ls->vstack;
      uVar1 = (var->u).s.aux;
      pVVar3[uVar1].info = pVVar3[uVar1].info | 1;
      expr_toval(fs,e);
      if (e->k < VKSTR) {
        ra_1 = (var->u).s.info << 8 | 0x31 | e->k << 0x10;
      }
      else if (e->k == VKSTR) {
        uVar2 = (var->u).s.info;
        BVar4 = const_str(fs,e);
        ra_1 = uVar2 << 8 | 0x2f | BVar4 << 0x10;
      }
      else if (e->k == VKLAST) {
        uVar2 = (var->u).s.info;
        BVar4 = const_num(fs,e);
        ra_1 = uVar2 << 8 | 0x30 | BVar4 << 0x10;
      }
      else {
        uVar2 = (var->u).s.info;
        BVar4 = expr_toanyreg(fs,e);
        ra_1 = uVar2 << 8 | 0x2e | BVar4 << 0x10;
      }
    }
    else if (var->k == VGLOBAL) {
      BVar4 = expr_toanyreg(fs,e);
      BVar5 = const_str(fs,var);
      ra_1 = BVar4 << 8 | 0x37 | BVar5 << 0x10;
    }
    else {
      BVar4 = expr_toanyreg(fs,e);
      uVar1 = (var->u).s.aux;
      if ((int)uVar1 < 0) {
        ra_1 = BVar4 << 8 | 0x3d | (var->u).s.info << 0x18 | (uVar1 ^ 0xffffffff) << 0x10;
      }
      else if (uVar1 < 0x100) {
        ra_1 = BVar4 << 8 | 0x3c | (var->u).s.info << 0x18 | uVar1 << 0x10;
      }
      else {
        ra_1 = BVar4 << 8 | 0x3e | (var->u).s.info << 0x18 | (uVar1 - 0x100) * 0x10000;
      }
    }
    bcemit_INS(fs,ra_1);
    expr_free(fs,e);
  }
  return;
}

Assistant:

static void bcemit_store(FuncState *fs, ExpDesc *var, ExpDesc *e)
{
  BCIns ins;
  if (var->k == VLOCAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_free(fs, e);
    expr_toreg(fs, e, var->u.s.info);
    return;
  } else if (var->k == VUPVAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_toval(fs, e);
    if (e->k <= VKTRUE)
      ins = BCINS_AD(BC_USETP, var->u.s.info, const_pri(e));
    else if (e->k == VKSTR)
      ins = BCINS_AD(BC_USETS, var->u.s.info, const_str(fs, e));
    else if (e->k == VKNUM)
      ins = BCINS_AD(BC_USETN, var->u.s.info, const_num(fs, e));
    else
      ins = BCINS_AD(BC_USETV, var->u.s.info, expr_toanyreg(fs, e));
  } else if (var->k == VGLOBAL) {
    BCReg ra = expr_toanyreg(fs, e);
    ins = BCINS_AD(BC_GSET, ra, const_str(fs, var));
  } else {
    BCReg ra, rc;
    lj_assertFS(var->k == VINDEXED, "bad expr type %d", var->k);
    ra = expr_toanyreg(fs, e);
    rc = var->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TSETS, ra, var->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TSETB, ra, var->u.s.info, rc-(BCMAX_C+1));
    } else {
#ifdef LUA_USE_ASSERT
      /* Free late alloced key reg to avoid assert on free of value reg. */
      /* This can only happen when called from expr_table(). */
      if (e->k == VNONRELOC && ra >= fs->nactvar && rc >= ra)
	bcreg_free(fs, rc);
#endif
      ins = BCINS_ABC(BC_TSETV, ra, var->u.s.info, rc);
    }
  }
  bcemit_INS(fs, ins);
  expr_free(fs, e);
}